

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.hh
# Opt level: O0

expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Xformable::GetLocalMatrix_abi_cxx11_
          (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Xformable *this,double t,TimeSampleInterpolationType tinterp,
          bool *resetTransformStack)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  byte local_109;
  undefined1 local_108 [48];
  undefined1 local_d8 [8];
  string err;
  matrix4d m;
  bool *resetTransformStack_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  Xformable *this_local;
  
  local_109 = 1;
  if ((this->_dirty & 1U) == 0) {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)(m.m[3] + 3),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)(m.m[3] + 3));
    local_109 = bVar1 ^ 0xff;
  }
  if ((local_109 & 1) != 0) {
    tinyusdz::value::matrix4d::matrix4d((matrix4d *)((long)&err.field_2 + 8));
    ::std::__cxx11::string::string((string *)local_d8);
    bVar1 = EvaluateXformOps(this,t,tinterp,(matrix4d *)((long)&err.field_2 + 8),resetTransformStack
                             ,(string *)local_d8);
    if (bVar1) {
      tinyusdz::value::TimeCode::TimeCode((TimeCode *)(local_108 + 0x28),t);
      bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)(local_108 + 0x28));
      if (bVar1) {
        memcpy(&this->_matrix,(void *)((long)&err.field_2 + 8),0x80);
        this->_dirty = false;
        local_108._36_4_ = 0;
      }
      else {
        nonstd::expected_lite::
        expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<tinyusdz::value::matrix4d,_0>
                  (__return_storage_ptr__,(matrix4d *)((long)&err.field_2 + 8));
        local_108._36_4_ = 1;
      }
    }
    else {
      nonstd::expected_lite::make_unexpected<std::__cxx11::string&>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_108,(expected_lite *)local_d8,value);
      nonstd::expected_lite::
      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                  *)local_108);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_108);
      local_108._36_4_ = 1;
    }
    ::std::__cxx11::string::~string((string *)local_d8);
    if (local_108._36_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  nonstd::expected_lite::
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<tinyusdz::value::matrix4d_&,_0>(__return_storage_ptr__,&this->_matrix);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<value::matrix4d, std::string> GetLocalMatrix(double t = value::TimeCode::Default(), value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Linear, bool *resetTransformStack = nullptr) const {
    if (_dirty || !value::TimeCode(t).is_default()) {
      value::matrix4d m;
      std::string err;
      if (EvaluateXformOps(t, tinterp, &m, resetTransformStack, &err)) {
        if (value::TimeCode(t).is_default()) {
          _matrix = m;
          _dirty = false;
        }
        else {
          return m;
        }
      } else {
        return nonstd::make_unexpected(err);
      }
    }

    return _matrix;
  }